

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O3

void __thiscall
CorUnix::CSharedMemoryWaitableObject::CSharedMemoryWaitableObject
          (CSharedMemoryWaitableObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock)

{
  LIST_ENTRY *pLVar1;
  
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_lRefCount = 1;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pvImmutableData = (VOID *)0x0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pvLocalData = (VOID *)0x0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot = pot;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_oa.sObjectName.m_dwStringLength = 0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_oa.sObjectName.m_dwMaxLength = 0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_oa.pSecurityAttributes =
       (LPSECURITY_ATTRIBUTES)0x0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_sdlLocalData.super_IDataLock.
  _vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_014c2bf0;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_sdlLocalData.m_fInitialized = false;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pthrCleanup = (CPalThread *)0x0;
  (this->super_CSharedMemoryObject).m_pcsObjListLock = pcsObjListLock;
  (this->super_CSharedMemoryObject).m_shmod = 0;
  (this->super_CSharedMemoryObject).m_pvSharedData = (VOID *)0x0;
  (this->super_CSharedMemoryObject).m_ssmlSharedData.super_IDataLock._vptr_IDataLock =
       (_func_int **)&PTR_ReleaseLock_014c2e48;
  (this->super_CSharedMemoryObject).m_sdlSharedData.super_IDataLock._vptr_IDataLock =
       (_func_int **)&PTR_ReleaseLock_014c2bf0;
  (this->super_CSharedMemoryObject).m_sdlSharedData.m_fInitialized = false;
  (this->super_CSharedMemoryObject).m_ObjectDomain = ProcessLocalObject;
  (this->super_CSharedMemoryObject).m_fSharedDataDereferenced = 0;
  (this->super_CSharedMemoryObject).m_fDeleteSharedData = 0;
  pLVar1 = &(this->super_CSharedMemoryObject).m_le;
  (this->super_CSharedMemoryObject).m_le.Blink = pLVar1;
  (this->super_CSharedMemoryObject).m_le.Flink = pLVar1;
  (this->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_014c2cf0;
  this->m_pvSynchData = (VOID *)0x0;
  return;
}

Assistant:

CSharedMemoryWaitableObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock
            )
            :
            CSharedMemoryObject(pot, pcsObjListLock),
            m_pvSynchData(NULL)
        {
        }